

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpSubscriptionRequest.c
# Opt level: O3

UpnpSubscriptionRequest * UpnpSubscriptionRequest_new(void)

{
  UpnpSubscriptionRequest *pUVar1;
  UpnpString *pUVar2;
  
  pUVar1 = (UpnpSubscriptionRequest *)calloc(1,0x18);
  if (pUVar1 != (UpnpSubscriptionRequest *)0x0) {
    pUVar2 = UpnpString_new();
    pUVar1->m_ServiceId = pUVar2;
    pUVar2 = UpnpString_new();
    pUVar1->m_UDN = pUVar2;
    pUVar2 = UpnpString_new();
    pUVar1->m_SID = pUVar2;
  }
  return pUVar1;
}

Assistant:

UpnpSubscriptionRequest *UpnpSubscriptionRequest_new(void)
{
	struct s_UpnpSubscriptionRequest *p =
		calloc(1, sizeof(struct s_UpnpSubscriptionRequest));

	if (!p)
		return 0;

	p->m_ServiceId = UpnpString_new();
	p->m_UDN = UpnpString_new();
	p->m_SID = UpnpString_new();

	return (UpnpSubscriptionRequest *)p;
}